

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISConsole.cpp
# Opt level: O2

bool __thiscall EventHandler::keyPressed(EventHandler *this,KeyEvent *arg)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout," KeyPressed {");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(arg + 0x10));
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = std::operator<<(poVar1,"} || Character (");
  poVar1 = std::operator<<(poVar1,(char)arg[0x14]);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (*(int *)(arg + 0x10) == 200) {
    std::operator<<((ostream *)&std::cout,"up key!\n");
  }
  return true;
}

Assistant:

bool keyPressed(const KeyEvent& arg)
	{
		std::cout << " KeyPressed {" << std::hex << arg.key << std::dec
				  << "} || Character (" << (char)arg.text << ")" << std::endl;

		if(arg.key == OIS::KeyCode::KC_UP)
		{
			std::cout << "up key!\n";
		}

		return true;
	}